

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_50b80c::cmAppendPathSegmentGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmAppendPathSegmentGenerator *this,string *parent)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_50 [32];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined8 local_20;
  undefined1 *local_18;
  size_t local_10;
  char *pcStack_8;
  
  if (this->NeedReset == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return (string *)&__return_storage_ptr__->field_2;
  }
  this->NeedReset = true;
  local_18 = local_50;
  local_50[0] = 0x2f;
  local_20 = 1;
  local_10 = (this->DirName)._M_len;
  pcStack_8 = (this->DirName)._M_str;
  views._M_len = 3;
  views._M_array = &local_30;
  local_30._M_str = (char *)parent;
  psVar1 = cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return psVar1;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->NeedReset) {
      return {};
    }
    this->NeedReset = true;
    return cmStrCat(parent, '/', this->DirName);
  }